

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

TypeMetaFunction * __thiscall
soul::StructuralParser::parseTypeMetaFunction(StructuralParser *this,Context *context,Op op)

{
  Expression *args_1;
  TypeMetaFunction *pTVar1;
  Expression *t;
  Op local_1c;
  Context *pCStack_18;
  Op op_local;
  Context *context_local;
  StructuralParser *this_local;
  
  local_1c = op;
  pCStack_18 = context;
  context_local = (Context *)this;
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x573c42);
  args_1 = parseType(this,metaFunctionArgument);
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x571824);
  pTVar1 = allocate<soul::AST::TypeMetaFunction,soul::AST::Context_const&,soul::AST::Expression&,soul::AST::TypeMetaFunction::Op&>
                     (this,pCStack_18,args_1,&local_1c);
  return pTVar1;
}

Assistant:

AST::TypeMetaFunction& parseTypeMetaFunction (const AST::Context& context, AST::TypeMetaFunction::Op op)
    {
        expect (Operator::openParen);
        auto& t = parseType (ParseTypeContext::metaFunctionArgument);
        expect (Operator::closeParen);
        return allocate<AST::TypeMetaFunction> (context, t, op);
    }